

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPInform.cpp
# Opt level: O3

void inform_callback(list<InformItem_*,_std::allocator<InformItem_*>_> *informList,
                    snmp_request_id_t requestID,bool responseReceiveSuccess)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(InformItem_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/src/SNMPInform.cpp:71:41)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(InformItem_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/src/SNMPInform.cpp:71:41)>
             ::_M_manager;
  local_28._M_unused._M_member_pointer = requestID;
  remove_inform_from_list(informList,(function<bool_(InformItem_*)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void inform_callback(std::list<struct InformItem *> &informList, snmp_request_id_t requestID, bool responseReceiveSuccess) {
    (void)responseReceiveSuccess;
    SNMP_LOGD("Receiving InformCallback for requestID: %lu, success: %d\n", requestID, responseReceiveSuccess);
    //TODO: if we ever want to keep received informs, change this logic

    remove_inform_from_list(informList, [requestID](struct InformItem* informItem) -> bool {
        return informItem->requestID == requestID;
    });

    SNMP_LOGD("Informs waiting for responses: %lu\n", informList.size());
}